

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_ecdsa_recoverable_signature_save
               (secp256k1_ecdsa_recoverable_signature *sig,secp256k1_scalar *r,secp256k1_scalar *s,
               int recid)

{
  int recid_local;
  secp256k1_scalar *s_local;
  secp256k1_scalar *r_local;
  secp256k1_ecdsa_recoverable_signature *sig_local;
  
  *(uint64_t *)sig->data = r->d[0];
  *(uint64_t *)(sig->data + 8) = r->d[1];
  *(uint64_t *)(sig->data + 0x10) = r->d[2];
  *(uint64_t *)(sig->data + 0x18) = r->d[3];
  *(uint64_t *)(sig->data + 0x20) = s->d[0];
  *(uint64_t *)(sig->data + 0x28) = s->d[1];
  *(uint64_t *)(sig->data + 0x30) = s->d[2];
  *(uint64_t *)(sig->data + 0x38) = s->d[3];
  sig->data[0x40] = (uchar)recid;
  return;
}

Assistant:

static void secp256k1_ecdsa_recoverable_signature_save(secp256k1_ecdsa_recoverable_signature* sig, const secp256k1_scalar* r, const secp256k1_scalar* s, int recid) {
    if (sizeof(secp256k1_scalar) == 32) {
        memcpy(&sig->data[0], r, 32);
        memcpy(&sig->data[32], s, 32);
    } else {
        secp256k1_scalar_get_b32(&sig->data[0], r);
        secp256k1_scalar_get_b32(&sig->data[32], s);
    }
    sig->data[64] = recid;
}